

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::ReadPixels::ReadPixels
          (ReadPixels *this,int x,int y,int width,int height,GLenum format,GLenum type,
          SharedPtr<tcu::ThreadUtil::DataBlock> *data,bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  DataBlock *this_00;
  SharedPtrStateBase *pSVar3;
  SharedPtr<tcu::ThreadUtil::Event> local_40;
  
  Operation::Operation(&this->super_Operation,"ReadPixels",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__ReadPixels_003eafa0;
  this->m_x = x;
  this->m_y = y;
  this->m_width = width;
  this->m_height = height;
  this->m_format = format;
  this->m_type = type;
  (this->m_data).m_ptr = (DataBlock *)0x0;
  (this->m_data).m_state = (SharedPtrStateBase *)0x0;
  this_00 = (DataBlock *)operator_new(0x50);
  local_40.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_40.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::DataBlock::DataBlock(this_00,&local_40);
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_003eb7e8;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSVar2 = data->m_state;
  if (pSVar2 != pSVar3) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        data->m_ptr = (DataBlock *)0x0;
        (*data->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &data->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (data->m_state != (SharedPtrStateBase *)0x0) {
          (*data->m_state->_vptr_SharedPtrStateBase[1])();
        }
        data->m_state = (SharedPtrStateBase *)0x0;
      }
    }
    data->m_ptr = this_00;
    data->m_state = pSVar3;
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &data->m_state->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar3->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar3->_vptr_SharedPtrStateBase[2])(pSVar3);
  }
  LOCK();
  pdVar1 = &pSVar3->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])(pSVar3);
  }
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_40.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40.m_ptr = (Event *)0x0;
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_40.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_40.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_40.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = (this->m_data).m_state;
  if (pSVar2 != data->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_data).m_ptr = (DataBlock *)0x0;
        (*((this->m_data).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_data).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_data).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_data).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_data).m_ptr = data->m_ptr;
    pSVar2 = data->m_state;
    (this->m_data).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_data).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

ReadPixels::ReadPixels (int x, int y, int width, int height, GLenum format, GLenum type, SharedPtr<tcu::ThreadUtil::DataBlock>& data, bool useSync, bool serverSync)
	: Operation	("ReadPixels", useSync, serverSync)
	, m_x		(x)
	, m_y		(y)
	, m_width	(width)
	, m_height	(height)
	, m_format	(format)
	, m_type	(type)
{
	data = SharedPtr<tcu::ThreadUtil::DataBlock>(new tcu::ThreadUtil::DataBlock(getEvent()));
	m_data = data;
}